

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wedge_utils_sse2.c
# Opt level: O2

int8_t av1_wedge_sign_from_residuals_sse2(int16_t *ds,uint8_t *m,int N,int64_t limit)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  long lVar41;
  int iVar42;
  int iVar45;
  int iVar46;
  undefined1 auVar43 [16];
  int iVar47;
  undefined1 auVar44 [16];
  int iVar48;
  int iVar52;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  
  lVar41 = 0;
  auVar43 = (undefined1  [16])0x0;
  auVar49 = (undefined1  [16])0x0;
  do {
    auVar44 = *(undefined1 (*) [16])(m + lVar41);
    auVar1[0xd] = 0;
    auVar1._0_13_ = auVar44._0_13_;
    auVar1[0xe] = auVar44[7];
    auVar5[0xc] = auVar44[6];
    auVar5._0_12_ = auVar44._0_12_;
    auVar5._13_2_ = auVar1._13_2_;
    auVar9[0xb] = 0;
    auVar9._0_11_ = auVar44._0_11_;
    auVar9._12_3_ = auVar5._12_3_;
    auVar13[10] = auVar44[5];
    auVar13._0_10_ = auVar44._0_10_;
    auVar13._11_4_ = auVar9._11_4_;
    auVar17[9] = 0;
    auVar17._0_9_ = auVar44._0_9_;
    auVar17._10_5_ = auVar13._10_5_;
    auVar21[8] = auVar44[4];
    auVar21._0_8_ = auVar44._0_8_;
    auVar21._9_6_ = auVar17._9_6_;
    auVar29._7_8_ = 0;
    auVar29._0_7_ = auVar21._8_7_;
    auVar33._1_8_ = SUB158(auVar29 << 0x40,7);
    auVar33[0] = auVar44[3];
    auVar33._9_6_ = 0;
    auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
    auVar34[0] = auVar44[2];
    auVar34._11_4_ = 0;
    auVar25[2] = auVar44[1];
    auVar25._0_2_ = auVar44._0_2_;
    auVar25._3_12_ = SUB1512(auVar34 << 0x20,3);
    auVar51._0_2_ = auVar44._0_2_ & 0xff;
    auVar51._2_13_ = auVar25._2_13_;
    auVar51[0xf] = 0;
    auVar56 = pmaddwd(auVar51,*(undefined1 (*) [16])(ds + lVar41));
    iVar42 = auVar49._8_4_;
    iVar45 = auVar49._12_4_;
    auVar51 = *(undefined1 (*) [16])(m + lVar41 + 0x10);
    auVar54 = *(undefined1 (*) [16])(m + lVar41 + 0x20);
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar54._0_13_;
    auVar2[0xe] = auVar54[7];
    auVar6[0xc] = auVar54[6];
    auVar6._0_12_ = auVar54._0_12_;
    auVar6._13_2_ = auVar2._13_2_;
    auVar10[0xb] = 0;
    auVar10._0_11_ = auVar54._0_11_;
    auVar10._12_3_ = auVar6._12_3_;
    auVar14[10] = auVar54[5];
    auVar14._0_10_ = auVar54._0_10_;
    auVar14._11_4_ = auVar10._11_4_;
    auVar18[9] = 0;
    auVar18._0_9_ = auVar54._0_9_;
    auVar18._10_5_ = auVar14._10_5_;
    auVar22[8] = auVar54[4];
    auVar22._0_8_ = auVar54._0_8_;
    auVar22._9_6_ = auVar18._9_6_;
    auVar30._7_8_ = 0;
    auVar30._0_7_ = auVar22._8_7_;
    auVar35._1_8_ = SUB158(auVar30 << 0x40,7);
    auVar35[0] = auVar54[3];
    auVar35._9_6_ = 0;
    auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
    auVar36[0] = auVar54[2];
    auVar36._11_4_ = 0;
    auVar26[2] = auVar54[1];
    auVar26._0_2_ = auVar54._0_2_;
    auVar26._3_12_ = SUB1512(auVar36 << 0x20,3);
    auVar60._0_2_ = auVar54._0_2_ & 0xff;
    auVar60._2_13_ = auVar26._2_13_;
    auVar60[0xf] = 0;
    auVar57 = pmaddwd(auVar60,*(undefined1 (*) [16])(ds + lVar41 + 0x20));
    iVar46 = auVar43._8_4_;
    iVar47 = auVar43._12_4_;
    auVar60 = *(undefined1 (*) [16])(m + lVar41 + 0x30);
    auVar53[1] = 0;
    auVar53[0] = auVar44[8];
    auVar53[2] = auVar44[9];
    auVar53[3] = 0;
    auVar53[4] = auVar44[10];
    auVar53[5] = 0;
    auVar53[6] = auVar44[0xb];
    auVar53[7] = 0;
    auVar53[8] = auVar44[0xc];
    auVar53[9] = 0;
    auVar53[10] = auVar44[0xd];
    auVar53[0xb] = 0;
    auVar53[0xc] = auVar44[0xe];
    auVar53[0xd] = 0;
    auVar53[0xe] = auVar44[0xf];
    auVar53[0xf] = 0;
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar51._0_13_;
    auVar3[0xe] = auVar51[7];
    auVar7[0xc] = auVar51[6];
    auVar7._0_12_ = auVar51._0_12_;
    auVar7._13_2_ = auVar3._13_2_;
    auVar11[0xb] = 0;
    auVar11._0_11_ = auVar51._0_11_;
    auVar11._12_3_ = auVar7._12_3_;
    auVar15[10] = auVar51[5];
    auVar15._0_10_ = auVar51._0_10_;
    auVar15._11_4_ = auVar11._11_4_;
    auVar19[9] = 0;
    auVar19._0_9_ = auVar51._0_9_;
    auVar19._10_5_ = auVar15._10_5_;
    auVar23[8] = auVar51[4];
    auVar23._0_8_ = auVar51._0_8_;
    auVar23._9_6_ = auVar19._9_6_;
    auVar31._7_8_ = 0;
    auVar31._0_7_ = auVar23._8_7_;
    auVar37._1_8_ = SUB158(auVar31 << 0x40,7);
    auVar37[0] = auVar51[3];
    auVar37._9_6_ = 0;
    auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
    auVar38[0] = auVar51[2];
    auVar38._11_4_ = 0;
    auVar27[2] = auVar51[1];
    auVar27._0_2_ = auVar51._0_2_;
    auVar27._3_12_ = SUB1512(auVar38 << 0x20,3);
    auVar59._0_2_ = auVar51._0_2_ & 0xff;
    auVar59._2_13_ = auVar27._2_13_;
    auVar59[0xf] = 0;
    auVar50[1] = 0;
    auVar50[0] = auVar51[8];
    auVar50[2] = auVar51[9];
    auVar50[3] = 0;
    auVar50[4] = auVar51[10];
    auVar50[5] = 0;
    auVar50[6] = auVar51[0xb];
    auVar50[7] = 0;
    auVar50[8] = auVar51[0xc];
    auVar50[9] = 0;
    auVar50[10] = auVar51[0xd];
    auVar50[0xb] = 0;
    auVar50[0xc] = auVar51[0xe];
    auVar50[0xd] = 0;
    auVar50[0xe] = auVar51[0xf];
    auVar50[0xf] = 0;
    auVar58[1] = 0;
    auVar58[0] = auVar54[8];
    auVar58[2] = auVar54[9];
    auVar58[3] = 0;
    auVar58[4] = auVar54[10];
    auVar58[5] = 0;
    auVar58[6] = auVar54[0xb];
    auVar58[7] = 0;
    auVar58[8] = auVar54[0xc];
    auVar58[9] = 0;
    auVar58[10] = auVar54[0xd];
    auVar58[0xb] = 0;
    auVar58[0xc] = auVar54[0xe];
    auVar58[0xd] = 0;
    auVar58[0xe] = auVar54[0xf];
    auVar58[0xf] = 0;
    auVar4[0xd] = 0;
    auVar4._0_13_ = auVar60._0_13_;
    auVar4[0xe] = auVar60[7];
    auVar8[0xc] = auVar60[6];
    auVar8._0_12_ = auVar60._0_12_;
    auVar8._13_2_ = auVar4._13_2_;
    auVar12[0xb] = 0;
    auVar12._0_11_ = auVar60._0_11_;
    auVar12._12_3_ = auVar8._12_3_;
    auVar16[10] = auVar60[5];
    auVar16._0_10_ = auVar60._0_10_;
    auVar16._11_4_ = auVar12._11_4_;
    auVar20[9] = 0;
    auVar20._0_9_ = auVar60._0_9_;
    auVar20._10_5_ = auVar16._10_5_;
    auVar24[8] = auVar60[4];
    auVar24._0_8_ = auVar60._0_8_;
    auVar24._9_6_ = auVar20._9_6_;
    auVar32._7_8_ = 0;
    auVar32._0_7_ = auVar24._8_7_;
    auVar39._1_8_ = SUB158(auVar32 << 0x40,7);
    auVar39[0] = auVar60[3];
    auVar39._9_6_ = 0;
    auVar40._1_10_ = SUB1510(auVar39 << 0x30,5);
    auVar40[0] = auVar60[2];
    auVar40._11_4_ = 0;
    auVar28[2] = auVar60[1];
    auVar28._0_2_ = auVar60._0_2_;
    auVar28._3_12_ = SUB1512(auVar40 << 0x20,3);
    auVar61._0_2_ = auVar60._0_2_ & 0xff;
    auVar61._2_13_ = auVar28._2_13_;
    auVar61[0xf] = 0;
    auVar44[1] = 0;
    auVar44[0] = auVar60[8];
    auVar44[2] = auVar60[9];
    auVar44[3] = 0;
    auVar44[4] = auVar60[10];
    auVar44[5] = 0;
    auVar44[6] = auVar60[0xb];
    auVar44[7] = 0;
    auVar44[8] = auVar60[0xc];
    auVar44[9] = 0;
    auVar44[10] = auVar60[0xd];
    auVar44[0xb] = 0;
    auVar44[0xc] = auVar60[0xe];
    auVar44[0xd] = 0;
    auVar44[0xe] = auVar60[0xf];
    auVar44[0xf] = 0;
    auVar54 = pmaddwd(auVar53,*(undefined1 (*) [16])(ds + lVar41 + 8));
    auVar60 = pmaddwd(auVar59,*(undefined1 (*) [16])(ds + lVar41 + 0x10));
    auVar51 = pmaddwd(auVar50,*(undefined1 (*) [16])(ds + lVar41 + 0x18));
    iVar48 = auVar51._0_4_ + auVar60._0_4_ + auVar54._0_4_ + auVar56._0_4_ + auVar49._0_4_;
    iVar52 = auVar51._4_4_ + auVar60._4_4_ + auVar54._4_4_ + auVar56._4_4_ + auVar49._4_4_;
    auVar49._0_8_ = CONCAT44(iVar52,iVar48);
    auVar49._8_4_ = auVar51._8_4_ + auVar60._8_4_ + auVar54._8_4_ + auVar56._8_4_ + iVar42;
    auVar49._12_4_ = auVar51._12_4_ + auVar60._12_4_ + auVar54._12_4_ + auVar56._12_4_ + iVar45;
    auVar51 = pmaddwd(auVar58,*(undefined1 (*) [16])(ds + lVar41 + 0x28));
    auVar54 = pmaddwd(auVar61,*(undefined1 (*) [16])(ds + lVar41 + 0x30));
    auVar44 = pmaddwd(auVar44,*(undefined1 (*) [16])(ds + lVar41 + 0x38));
    iVar42 = auVar44._0_4_ + auVar54._0_4_ + auVar51._0_4_ + auVar57._0_4_ + auVar43._0_4_;
    iVar45 = auVar44._4_4_ + auVar54._4_4_ + auVar51._4_4_ + auVar57._4_4_ + auVar43._4_4_;
    auVar43._0_8_ = CONCAT44(iVar45,iVar42);
    auVar43._8_4_ = auVar44._8_4_ + auVar54._8_4_ + auVar51._8_4_ + auVar57._8_4_ + iVar46;
    auVar43._12_4_ = auVar44._12_4_ + auVar54._12_4_ + auVar51._12_4_ + auVar57._12_4_ + iVar47;
    lVar41 = lVar41 + 0x40;
  } while (N != (int)lVar41);
  auVar57._8_4_ = iVar52;
  auVar57._0_8_ = auVar49._0_8_;
  auVar57._12_4_ = iVar52 >> 0x1f;
  auVar56._0_8_ = (long)auVar49._8_4_;
  auVar56._8_4_ = auVar49._12_4_;
  auVar56._12_4_ = auVar49._12_4_ >> 0x1f;
  auVar55._8_4_ = iVar45;
  auVar55._0_8_ = auVar43._0_8_;
  auVar55._12_4_ = iVar45 >> 0x1f;
  auVar54._0_8_ = (long)auVar43._8_4_;
  auVar54._8_4_ = auVar43._12_4_;
  auVar54._12_4_ = auVar43._12_4_ >> 0x1f;
  return limit < auVar54._8_8_ + auVar55._8_8_ + auVar56._8_8_ + auVar57._8_8_ +
                 auVar54._0_8_ + iVar42 + auVar56._0_8_ + iVar48;
}

Assistant:

int8_t av1_wedge_sign_from_residuals_sse2(const int16_t *ds, const uint8_t *m,
                                          int N, int64_t limit) {
  int64_t acc;

  __m128i v_sign_d;
  __m128i v_acc0_d = _mm_setzero_si128();
  __m128i v_acc1_d = _mm_setzero_si128();
  __m128i v_acc_q;

  // Input size limited to 8192 by the use of 32 bit accumulators and m
  // being between [0, 64]. Overflow might happen at larger sizes,
  // though it is practically impossible on real video input.
  assert(N < 8192);
  assert(N % 64 == 0);

  do {
    const __m128i v_m01_b = xx_load_128(m);
    const __m128i v_m23_b = xx_load_128(m + 16);
    const __m128i v_m45_b = xx_load_128(m + 32);
    const __m128i v_m67_b = xx_load_128(m + 48);

    const __m128i v_d0_w = xx_load_128(ds);
    const __m128i v_d1_w = xx_load_128(ds + 8);
    const __m128i v_d2_w = xx_load_128(ds + 16);
    const __m128i v_d3_w = xx_load_128(ds + 24);
    const __m128i v_d4_w = xx_load_128(ds + 32);
    const __m128i v_d5_w = xx_load_128(ds + 40);
    const __m128i v_d6_w = xx_load_128(ds + 48);
    const __m128i v_d7_w = xx_load_128(ds + 56);

    const __m128i v_m0_w = _mm_unpacklo_epi8(v_m01_b, _mm_setzero_si128());
    const __m128i v_m1_w = _mm_unpackhi_epi8(v_m01_b, _mm_setzero_si128());
    const __m128i v_m2_w = _mm_unpacklo_epi8(v_m23_b, _mm_setzero_si128());
    const __m128i v_m3_w = _mm_unpackhi_epi8(v_m23_b, _mm_setzero_si128());
    const __m128i v_m4_w = _mm_unpacklo_epi8(v_m45_b, _mm_setzero_si128());
    const __m128i v_m5_w = _mm_unpackhi_epi8(v_m45_b, _mm_setzero_si128());
    const __m128i v_m6_w = _mm_unpacklo_epi8(v_m67_b, _mm_setzero_si128());
    const __m128i v_m7_w = _mm_unpackhi_epi8(v_m67_b, _mm_setzero_si128());

    const __m128i v_p0_d = _mm_madd_epi16(v_d0_w, v_m0_w);
    const __m128i v_p1_d = _mm_madd_epi16(v_d1_w, v_m1_w);
    const __m128i v_p2_d = _mm_madd_epi16(v_d2_w, v_m2_w);
    const __m128i v_p3_d = _mm_madd_epi16(v_d3_w, v_m3_w);
    const __m128i v_p4_d = _mm_madd_epi16(v_d4_w, v_m4_w);
    const __m128i v_p5_d = _mm_madd_epi16(v_d5_w, v_m5_w);
    const __m128i v_p6_d = _mm_madd_epi16(v_d6_w, v_m6_w);
    const __m128i v_p7_d = _mm_madd_epi16(v_d7_w, v_m7_w);

    const __m128i v_p01_d = _mm_add_epi32(v_p0_d, v_p1_d);
    const __m128i v_p23_d = _mm_add_epi32(v_p2_d, v_p3_d);
    const __m128i v_p45_d = _mm_add_epi32(v_p4_d, v_p5_d);
    const __m128i v_p67_d = _mm_add_epi32(v_p6_d, v_p7_d);

    const __m128i v_p0123_d = _mm_add_epi32(v_p01_d, v_p23_d);
    const __m128i v_p4567_d = _mm_add_epi32(v_p45_d, v_p67_d);

    v_acc0_d = _mm_add_epi32(v_acc0_d, v_p0123_d);
    v_acc1_d = _mm_add_epi32(v_acc1_d, v_p4567_d);

    ds += 64;
    m += 64;

    N -= 64;
  } while (N);

  v_sign_d = _mm_cmplt_epi32(v_acc0_d, _mm_setzero_si128());
  v_acc0_d = _mm_add_epi64(_mm_unpacklo_epi32(v_acc0_d, v_sign_d),
                           _mm_unpackhi_epi32(v_acc0_d, v_sign_d));

  v_sign_d = _mm_cmplt_epi32(v_acc1_d, _mm_setzero_si128());
  v_acc1_d = _mm_add_epi64(_mm_unpacklo_epi32(v_acc1_d, v_sign_d),
                           _mm_unpackhi_epi32(v_acc1_d, v_sign_d));

  v_acc_q = _mm_add_epi64(v_acc0_d, v_acc1_d);

  v_acc_q = _mm_add_epi64(v_acc_q, _mm_srli_si128(v_acc_q, 8));

#if AOM_ARCH_X86_64
  acc = _mm_cvtsi128_si64(v_acc_q);
#else
  xx_storel_64(&acc, v_acc_q);
#endif

  return acc > limit;
}